

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_status_mipsel(CPUMIPSState_conflict2 *env,target_ulong_conflict arg1)

{
  target_ulong_conflict arg1_local;
  CPUMIPSState_conflict2 *env_local;
  
  cpu_mips_store_status_mipsel(env,arg1);
  return;
}

Assistant:

void helper_mtc0_status(CPUMIPSState *env, target_ulong arg1)
{
    cpu_mips_store_status(env, arg1);

#if 0
    uint32_t val, old;
    val = env->CP0_Status;
    old = env->CP0_Status;
    if (qemu_loglevel_mask(CPU_LOG_EXEC)) {
        qemu_log("Status %08x (%08x) => %08x (%08x) Cause %08x",
                old, old & env->CP0_Cause & CP0Ca_IP_mask,
                val, val & env->CP0_Cause & CP0Ca_IP_mask,
                env->CP0_Cause);
        switch (cpu_mmu_index(env, false)) {
        case 3:
            qemu_log(", ERL\n");
            break;
        case MIPS_HFLAG_UM:
            qemu_log(", UM\n");
            break;
        case MIPS_HFLAG_SM:
            qemu_log(", SM\n");
            break;
        case MIPS_HFLAG_KM:
            qemu_log("\n");
            break;
        default:
            cpu_abort(env_cpu(env), "Invalid MMU mode!\n");
            break;
        }
    }
#endif
}